

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  byte bVar17;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar18;
  byte bVar19;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar20) [32];
  long lVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  Primitive *prim;
  ulong uVar26;
  bool bVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined4 uVar44;
  undefined8 uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  long lStack_2490;
  StackItemT<embree::NodeRefPtr<8>_> *local_2488;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return;
  }
  local_2488 = stack + 1;
  stack[0].dist = 0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar29._8_4_ = 0x7fffffff;
  auVar29._0_8_ = 0x7fffffff7fffffff;
  auVar29._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx512vl((undefined1  [16])aVar2,auVar29);
  auVar31._8_4_ = 0x219392ef;
  auVar31._0_8_ = 0x219392ef219392ef;
  auVar31._12_4_ = 0x219392ef;
  uVar13 = vcmpps_avx512vl(auVar29,auVar31,1);
  bVar27 = (bool)((byte)uVar13 & 1);
  auVar30._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * (int)aVar2.x;
  bVar27 = (bool)((byte)(uVar13 >> 1) & 1);
  auVar30._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * (int)aVar2.y;
  bVar27 = (bool)((byte)(uVar13 >> 2) & 1);
  auVar30._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * (int)aVar2.z;
  bVar27 = (bool)((byte)(uVar13 >> 3) & 1);
  auVar30._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * aVar2.field_3.a;
  auVar31 = vrcp14ps_avx512vl(auVar30);
  auVar32._8_4_ = 0x3f800000;
  auVar32._0_8_ = 0x3f8000003f800000;
  auVar32._12_4_ = 0x3f800000;
  auVar32 = vfnmadd213ps_avx512vl(auVar30,auVar31,auVar32);
  auVar29 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar1));
  auVar31 = vfmadd132ps_fma(auVar32,auVar31,auVar31);
  fVar40 = auVar31._0_4_;
  auVar32 = vmovshdup_avx(auVar31);
  uVar45 = auVar32._0_8_;
  auVar30 = vshufpd_avx(auVar31,auVar31,1);
  auVar46._8_4_ = 2;
  auVar46._0_8_ = 0x200000002;
  auVar46._12_4_ = 2;
  auVar46._16_4_ = 2;
  auVar46._20_4_ = 2;
  auVar46._24_4_ = 2;
  auVar46._28_4_ = 2;
  auVar12 = vpermps_avx2(auVar46,ZEXT1632(auVar31));
  fVar41 = fVar40 * (ray->super_RayK<1>).org.field_0.m128[0];
  auVar48._8_4_ = 1;
  auVar48._0_8_ = 0x100000001;
  auVar48._12_4_ = 1;
  auVar48._16_4_ = 1;
  auVar48._20_4_ = 1;
  auVar48._24_4_ = 1;
  auVar48._28_4_ = 1;
  auVar33 = ZEXT1632(CONCAT412(auVar31._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                               CONCAT48(auVar31._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                        CONCAT44(auVar31._4_4_ *
                                                 (ray->super_RayK<1>).org.field_0.m128[1],fVar41))))
  ;
  auVar48 = vpermps_avx2(auVar48,auVar33);
  auVar33 = vpermps_avx2(auVar46,auVar33);
  uVar13 = (ulong)(fVar40 < 0.0);
  uVar26 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x40;
  uVar23 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x80;
  uVar24 = uVar13 * 0x20 ^ 0x20;
  uVar44 = auVar8._0_4_;
  auVar50._4_4_ = uVar44;
  auVar50._0_4_ = uVar44;
  auVar50._8_4_ = uVar44;
  auVar50._12_4_ = uVar44;
  auVar50._16_4_ = uVar44;
  auVar50._20_4_ = uVar44;
  auVar50._24_4_ = uVar44;
  auVar50._28_4_ = uVar44;
  uVar44 = auVar29._0_4_;
  auVar42._4_4_ = uVar44;
  auVar42._0_4_ = uVar44;
  auVar42._8_4_ = uVar44;
  auVar42._12_4_ = uVar44;
  auVar42._16_4_ = uVar44;
  auVar42._20_4_ = uVar44;
  auVar42._24_4_ = uVar44;
  auVar42._28_4_ = uVar44;
  auVar51._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar41;
  auVar51._12_4_ = -fVar41;
  auVar51._16_4_ = -fVar41;
  auVar51._20_4_ = -fVar41;
  auVar51._24_4_ = -fVar41;
  auVar51._28_4_ = -fVar41;
  auVar52._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
  auVar52._8_4_ = auVar48._8_4_ ^ 0x80000000;
  auVar52._12_4_ = auVar48._12_4_ ^ 0x80000000;
  auVar52._16_4_ = auVar48._16_4_ ^ 0x80000000;
  auVar52._20_4_ = auVar48._20_4_ ^ 0x80000000;
  auVar52._24_4_ = auVar48._24_4_ ^ 0x80000000;
  auVar52._28_4_ = auVar48._28_4_ ^ 0x80000000;
  auVar53._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
  auVar53._8_4_ = auVar33._8_4_ ^ 0x80000000;
  auVar53._12_4_ = auVar33._12_4_ ^ 0x80000000;
  auVar53._16_4_ = auVar33._16_4_ ^ 0x80000000;
  auVar53._20_4_ = auVar33._20_4_ ^ 0x80000000;
  auVar53._24_4_ = auVar33._24_4_ ^ 0x80000000;
  auVar53._28_4_ = auVar33._28_4_ ^ 0x80000000;
  auVar48 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  do {
    auVar43 = ZEXT464((uint)fVar1);
    auVar49 = ZEXT3264(CONCAT428(fVar40,CONCAT424(fVar40,CONCAT420(fVar40,CONCAT416(fVar40,CONCAT412
                                                  (fVar40,CONCAT48(fVar40,CONCAT44(fVar40,fVar40))))
                                                  ))));
    auVar47 = ZEXT3264(CONCAT824(uVar45,CONCAT816(uVar45,CONCAT88(uVar45,uVar45))));
LAB_01c7f674:
    do {
      if (local_2488 == stack) {
        return;
      }
      pSVar18 = local_2488 + -1;
      local_2488 = local_2488 + -1;
    } while (auVar43._0_4_ < (float)pSVar18->dist);
    sVar25 = (local_2488->ptr).ptr;
LAB_01c7f69b:
    uVar44 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
    auVar37._4_4_ = uVar44;
    auVar37._0_4_ = uVar44;
    auVar37._8_4_ = uVar44;
    auVar37._12_4_ = uVar44;
    auVar37._16_4_ = uVar44;
    auVar37._20_4_ = uVar44;
    auVar37._24_4_ = uVar44;
    auVar37._28_4_ = uVar44;
    while ((sVar25 & 8) == 0) {
      pauVar20 = (undefined1 (*) [32])(sVar25 & 0xfffffffffffffff0);
      auVar8 = vfmadd213ps_fma(pauVar20[uVar13 + 8],auVar37,pauVar20[uVar13 + 2]);
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar49._0_32_,auVar51);
      auVar46 = vmaxps_avx(auVar50,ZEXT1632(auVar8));
      auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar26),auVar37,
                               *(undefined1 (*) [32])(pauVar20[2] + uVar26));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar23),auVar37,
                                *(undefined1 (*) [32])(pauVar20[2] + uVar23));
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar47._0_32_,auVar52);
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar12,auVar53);
      auVar36 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar29));
      auVar46 = vmaxps_avx(auVar46,auVar36);
      auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + uVar24),auVar37,
                               *(undefined1 (*) [32])(pauVar20[2] + uVar24));
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar49._0_32_,auVar51);
      auVar36 = vminps_avx(auVar42,ZEXT1632(auVar8));
      auVar8 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + (uVar26 ^ 0x20)),auVar37,
                               *(undefined1 (*) [32])(pauVar20[2] + (uVar26 ^ 0x20)));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + (uVar23 ^ 0x20)),auVar37,
                                *(undefined1 (*) [32])(pauVar20[2] + (uVar23 ^ 0x20)));
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar47._0_32_,auVar52);
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar12,auVar53);
      auVar9 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar29));
      auVar36 = vminps_avx(auVar36,auVar9);
      uVar28 = vcmpps_avx512vl(auVar46,auVar36,2);
      if (((uint)sVar25 & 7) == 6) {
        uVar14 = vcmpps_avx512vl(auVar37,pauVar20[0xe],0xd);
        uVar15 = vcmpps_avx512vl(auVar37,pauVar20[0xf],1);
        uVar28 = uVar28 & uVar14 & uVar15;
      }
      bVar19 = (byte)uVar28;
      if (bVar19 == 0) {
        auVar8 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                        ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
        auVar43 = ZEXT1664(auVar8);
        goto LAB_01c7f674;
      }
      auVar36 = *pauVar20;
      auVar9 = pauVar20[1];
      auVar34 = vpternlogd_avx512vl(auVar48,auVar46,auVar33,0xf8);
      auVar35 = vpcompressd_avx512vl(auVar34);
      auVar39._0_4_ = (uint)(bVar19 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar34._0_4_
      ;
      bVar27 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar27 * auVar35._4_4_ | (uint)!bVar27 * auVar34._4_4_;
      bVar27 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar27 * auVar35._8_4_ | (uint)!bVar27 * auVar34._8_4_;
      bVar27 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar27 * auVar35._12_4_ | (uint)!bVar27 * auVar34._12_4_;
      bVar27 = (bool)((byte)(uVar28 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar27 * auVar35._16_4_ | (uint)!bVar27 * auVar34._16_4_;
      bVar27 = (bool)((byte)(uVar28 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar27 * auVar35._20_4_ | (uint)!bVar27 * auVar34._20_4_;
      bVar27 = (bool)((byte)(uVar28 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar27 * auVar35._24_4_ | (uint)!bVar27 * auVar34._24_4_;
      bVar27 = SUB81(uVar28 >> 7,0);
      auVar39._28_4_ = (uint)bVar27 * auVar35._28_4_ | (uint)!bVar27 * auVar34._28_4_;
      auVar34 = vpermt2q_avx512vl(auVar36,auVar39,auVar9);
      sVar25 = auVar34._0_8_;
      bVar19 = bVar19 - 1 & bVar19;
      if (bVar19 != 0) goto LAB_01c7f7d4;
    }
    lVar21 = (ulong)((uint)sVar25 & 0xf) - 8;
    prim = (Primitive *)(sVar25 & 0xfffffffffffffff0);
    while (bVar27 = lVar21 != 0, lVar21 = lVar21 + -1, bVar27) {
      InstanceArrayIntersector1MB::intersect(&pre,ray,context,prim);
      prim = prim + 1;
    }
    fVar1 = (ray->super_RayK<1>).tfar;
    auVar42._4_4_ = fVar1;
    auVar42._0_4_ = fVar1;
    auVar42._8_4_ = fVar1;
    auVar42._12_4_ = fVar1;
    auVar42._16_4_ = fVar1;
    auVar42._20_4_ = fVar1;
    auVar42._24_4_ = fVar1;
    auVar42._28_4_ = fVar1;
    fVar1 = (ray->super_RayK<1>).tfar;
    auVar48 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  } while( true );
LAB_01c7f7d4:
  auVar37 = vpshufd_avx2(auVar39,0x55);
  vpermt2q_avx512vl(auVar36,auVar37,auVar9);
  auVar34 = vpminsd_avx2(auVar39,auVar37);
  auVar37 = vpmaxsd_avx2(auVar39,auVar37);
  bVar19 = bVar19 - 1 & bVar19;
  if (bVar19 == 0) {
    auVar34 = vpermi2q_avx512vl(auVar34,auVar36,auVar9);
    sVar25 = auVar34._0_8_;
    auVar36 = vpermt2q_avx512vl(auVar36,auVar37,auVar9);
    (local_2488->ptr).ptr = auVar36._0_8_;
    lVar21 = 8;
    lStack_2490 = 0x10;
  }
  else {
    auVar11 = vpshufd_avx2(auVar39,0xaa);
    vpermt2q_avx512vl(auVar36,auVar11,auVar9);
    auVar35 = vpminsd_avx2(auVar34,auVar11);
    auVar34 = vpmaxsd_avx2(auVar34,auVar11);
    auVar11 = vpminsd_avx2(auVar37,auVar34);
    auVar34 = vpmaxsd_avx2(auVar37,auVar34);
    bVar19 = bVar19 - 1 & bVar19;
    if (bVar19 == 0) {
      auVar37 = vpermi2q_avx512vl(auVar35,auVar36,auVar9);
      sVar25 = auVar37._0_8_;
      auVar37 = vpermt2q_avx512vl(auVar36,auVar34,auVar9);
      (local_2488->ptr).ptr = auVar37._0_8_;
      auVar37 = vpermd_avx2(auVar34,auVar46);
      local_2488->dist = auVar37._0_4_;
      auVar37 = vpermt2q_avx512vl(auVar36,auVar11,auVar9);
      local_2488[1].ptr.ptr = auVar37._0_8_;
      lVar21 = 0x18;
      lStack_2490 = 0x20;
      auVar37 = auVar11;
    }
    else {
      auVar37 = vpshufd_avx2(auVar39,0xff);
      vpermt2q_avx512vl(auVar36,auVar37,auVar9);
      auVar10 = vpminsd_avx2(auVar35,auVar37);
      auVar35 = vpmaxsd_avx2(auVar35,auVar37);
      auVar37 = vpminsd_avx2(auVar11,auVar35);
      auVar35 = vpmaxsd_avx2(auVar11,auVar35);
      auVar11 = vpminsd_avx2(auVar34,auVar35);
      auVar34 = vpmaxsd_avx2(auVar34,auVar35);
      bVar19 = bVar19 - 1 & bVar19;
      if (bVar19 != 0) {
        auVar38 = valignd_avx512vl(auVar39,auVar39,3);
        auVar35 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
        auVar39 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar35,auVar10);
        auVar35 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar37 = vpermt2d_avx512vl(auVar39,auVar35,auVar37);
        auVar35 = vpermt2d_avx512vl(auVar37,auVar35,auVar11);
        auVar37 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar37 = vpermt2d_avx512vl(auVar35,auVar37,auVar34);
        auVar43 = ZEXT3264(auVar37);
        bVar22 = bVar19;
        do {
          auVar34 = auVar43._0_32_;
          auVar35._8_4_ = 1;
          auVar35._0_8_ = 0x100000001;
          auVar35._12_4_ = 1;
          auVar35._16_4_ = 1;
          auVar35._20_4_ = 1;
          auVar35._24_4_ = 1;
          auVar35._28_4_ = 1;
          auVar37 = vpermd_avx2(auVar35,auVar38);
          auVar38 = valignd_avx512vl(auVar38,auVar38,1);
          vpermt2q_avx512vl(auVar36,auVar38,auVar9);
          bVar22 = bVar22 - 1 & bVar22;
          uVar16 = vpcmpd_avx512vl(auVar37,auVar34,5);
          auVar37 = vpmaxsd_avx2(auVar37,auVar34);
          bVar17 = (byte)uVar16 << 1;
          auVar34 = valignd_avx512vl(auVar34,auVar34,7);
          bVar27 = (bool)((byte)uVar16 & 1);
          bVar3 = (bool)(bVar17 >> 2 & 1);
          bVar4 = (bool)(bVar17 >> 3 & 1);
          bVar5 = (bool)(bVar17 >> 4 & 1);
          bVar6 = (bool)(bVar17 >> 5 & 1);
          bVar7 = (bool)(bVar17 >> 6 & 1);
          auVar43 = ZEXT3264(CONCAT428((uint)(bVar17 >> 7) * auVar34._28_4_ |
                                       (uint)!(bool)(bVar17 >> 7) * auVar37._28_4_,
                                       CONCAT424((uint)bVar7 * auVar34._24_4_ |
                                                 (uint)!bVar7 * auVar37._24_4_,
                                                 CONCAT420((uint)bVar6 * auVar34._20_4_ |
                                                           (uint)!bVar6 * auVar37._20_4_,
                                                           CONCAT416((uint)bVar5 * auVar34._16_4_ |
                                                                     (uint)!bVar5 * auVar37._16_4_,
                                                                     CONCAT412((uint)bVar4 *
                                                                               auVar34._12_4_ |
                                                                               (uint)!bVar4 *
                                                                               auVar37._12_4_,
                                                                               CONCAT48((uint)bVar3
                                                                                        * auVar34.
                                                  _8_4_ | (uint)!bVar3 * auVar37._8_4_,
                                                  CONCAT44((uint)bVar27 * auVar34._4_4_ |
                                                           (uint)!bVar27 * auVar37._4_4_,
                                                           auVar37._0_4_))))))));
        } while (bVar22 != 0);
        lVar21 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
        while( true ) {
          auVar34 = auVar43._0_32_;
          auVar37 = vpermt2q_avx512vl(auVar36,auVar34,auVar9);
          sVar25 = auVar37._0_8_;
          bVar27 = lVar21 == 0;
          lVar21 = lVar21 + -1;
          if (bVar27) break;
          (local_2488->ptr).ptr = sVar25;
          auVar37 = vpermd_avx2(auVar34,auVar46);
          local_2488->dist = auVar37._0_4_;
          auVar37 = valignd_avx512vl(auVar34,auVar34,1);
          auVar43 = ZEXT3264(auVar37);
          local_2488 = local_2488 + 1;
        }
        auVar49 = ZEXT3264(CONCAT428(fVar40,CONCAT424(fVar40,CONCAT420(fVar40,CONCAT416(fVar40,
                                                  CONCAT412(fVar40,CONCAT48(fVar40,CONCAT44(fVar40,
                                                  fVar40))))))));
        auVar47 = ZEXT3264(CONCAT824(uVar45,CONCAT816(uVar45,CONCAT88(uVar45,uVar45))));
        goto LAB_01c7f69b;
      }
      auVar35 = vpermi2q_avx512vl(auVar10,auVar36,auVar9);
      sVar25 = auVar35._0_8_;
      auVar35 = vpermt2q_avx512vl(auVar36,auVar34,auVar9);
      (local_2488->ptr).ptr = auVar35._0_8_;
      auVar34 = vpermd_avx2(auVar34,auVar46);
      local_2488->dist = auVar34._0_4_;
      auVar34 = vpermt2q_avx512vl(auVar36,auVar11,auVar9);
      local_2488[1].ptr.ptr = auVar34._0_8_;
      auVar34 = vpermd_avx2(auVar11,auVar46);
      local_2488[1].dist = auVar34._0_4_;
      auVar36 = vpermt2q_avx512vl(auVar36,auVar37,auVar9);
      local_2488[2].ptr.ptr = auVar36._0_8_;
      lStack_2490 = 0x28;
      lVar21 = lStack_2490;
      lStack_2490 = 0x30;
      auVar49 = ZEXT3264(CONCAT428(fVar40,CONCAT424(fVar40,CONCAT420(fVar40,CONCAT416(fVar40,
                                                  CONCAT412(fVar40,CONCAT48(fVar40,CONCAT44(fVar40,
                                                  fVar40))))))));
    }
    auVar47 = ZEXT3264(CONCAT824(uVar45,CONCAT816(uVar45,CONCAT88(uVar45,uVar45))));
  }
  auVar46 = vpermd_avx2(auVar37,auVar46);
  *(int *)((long)&(local_2488->ptr).ptr + lVar21) = auVar46._0_4_;
  local_2488 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(local_2488->ptr).ptr + lStack_2490);
  goto LAB_01c7f69b;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }